

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Buff * __thiscall Buff::operator=(Buff *this,Buff *rhs)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x800; lVar1 = lVar1 + 1) {
    this->_buf[lVar1] = rhs->_buf[lVar1];
  }
  this->_r_pos = (char *)(((long)rhs->_r_pos - (long)rhs) + (long)this);
  this->_w_pos = (char *)(((long)rhs->_w_pos - (long)rhs) + (long)this);
  return this;
}

Assistant:

Buff& operator=(const Buff& rhs) {
        for (int i = 0; i < LINE_MAX; ++i)
        {
            _buf[i] = rhs._buf[i];
        }

        _r_pos = _buf + (rhs._r_pos - rhs._buf);
        _w_pos = _buf + (rhs._w_pos - rhs._buf);
        return *this;
    }